

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeId.hpp
# Opt level: O0

long ableton::link::NodeId::random(void)

{
  size_t *this;
  anon_class_16_2_625aa075 __gen;
  result_type rVar1;
  iterator __first;
  iterator __last;
  uniform_int_distribution<unsigned_int> local_2734;
  uniform_int_distribution<unsigned_int> dist;
  undefined1 local_2720 [8];
  mt19937 gen;
  random_device rd;
  NodeId nodeId;
  
  std::random_device::random_device((random_device *)&gen._M_p);
  rVar1 = std::random_device::operator()((random_device *)&gen._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_2720,(ulong)rVar1);
  std::uniform_int_distribution<unsigned_int>::uniform_int_distribution(&local_2734,0x21,0x7e);
  this = &rd.field_0._M_mt._M_p;
  __first = std::array<unsigned_char,_8UL>::begin((array<unsigned_char,_8UL> *)this);
  __last = std::array<unsigned_char,_8UL>::end((array<unsigned_char,_8UL> *)this);
  __gen.gen = (mt19937 *)local_2720;
  __gen.dist = &local_2734;
  std::generate<unsigned_char*,ableton::link::NodeId::random()::_lambda()_1_>(__first,__last,__gen);
  std::random_device::~random_device((random_device *)&gen._M_p);
  return rd.field_0._M_mt._M_p;
}

Assistant:

static NodeId random()
  {
    using namespace std;

    random_device rd;
    mt19937 gen(rd());
    // uint8_t not standardized for this type - use unsigned
    uniform_int_distribution<unsigned> dist(33, 126); // printable ascii chars

    NodeId nodeId;
    generate(
      nodeId.begin(), nodeId.end(), [&] { return static_cast<uint8_t>(dist(gen)); });
    return nodeId;
  }